

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

ChannelGroupManifest * __thiscall
Imf_3_2::IDManifest::ChannelGroupManifest::operator<<(ChannelGroupManifest *this,uint64_t idValue)

{
  ArgExc *this_00;
  size_type sVar1;
  ChannelGroupManifest *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_vector<basic_string<char>_>_>_>::value,_pair<iterator,_bool>_>
  _Var2;
  stringstream _iex_throw_s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdd0;
  pair<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *this_01;
  size_type in_stack_fffffffffffffde8;
  map<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_1f8;
  _Base_ptr local_1b8;
  undefined1 local_1b0;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  if ((in_RDI->_insertingEntry & 1U) != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(local_188,
                    "not enough components inserted into previous entry in ID table before inserting new entry"
                   );
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::ArgExc::ArgExc(this_00,local_198);
    __cxa_throw(this_00,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
  }
  __x = (pair<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&in_RDI->_table;
  local_1f8._M_t._M_impl._0_8_ = 0;
  local_1f8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1f8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_1f8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this_01 = &local_1f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x210802);
  std::
  make_pair<unsigned_long&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&__x->first,in_stack_fffffffffffffdd0);
  _Var2 = std::
          map<unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
          ::
          insert<std::pair<unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (this_01,__x);
  local_1b8 = (_Base_ptr)_Var2.first._M_node;
  local_1b0 = _Var2.second;
  (in_RDI->_insertionIterator)._M_node = local_1b8;
  std::
  pair<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~pair((pair<unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x21087d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)0x210898);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI,in_stack_fffffffffffffde8);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&in_RDI->_components);
  if (sVar1 == 0) {
    in_RDI->_insertingEntry = false;
  }
  else {
    in_RDI->_insertingEntry = true;
  }
  return in_RDI;
}

Assistant:

IDManifest::ChannelGroupManifest&
IDManifest::ChannelGroupManifest::operator<< (uint64_t idValue)
{
    if (_insertingEntry)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "not enough components inserted into previous entry in ID table before inserting new entry");
    }

    _insertionIterator =
        _table.insert (make_pair (idValue, std::vector<std::string> ())).first;

    //
    // flush out previous entry: reinserting an attribute overwrites previous entry
    //
    _insertionIterator->second.resize (0);

    //
    // curious edge-case: it's possible to have an ID table with no strings, just a list of IDs
    // There's little purpose to this, but it means that this entry is now 'complete'
    //
    if (_components.size () == 0) { _insertingEntry = false; }
    else
    {
        _insertingEntry = true;
    }
    return *this;
}